

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StandardShapes.cpp
# Opt level: O2

uint Assimp::StandardShapes::MakeHexahedron
               (vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *positions,
               bool polygons)

{
  value_type *__x;
  undefined7 in_register_00000031;
  value_type *__x_00;
  value_type *__x_01;
  value_type *pvVar1;
  value_type *__x_02;
  value_type *__x_03;
  uint local_104;
  value_type local_100;
  value_type local_f0;
  value_type local_e0;
  value_type local_d0;
  value_type *local_c0;
  value_type *local_b8;
  value_type *local_b0;
  value_type *local_a8;
  value_type *local_a0;
  value_type *local_98;
  value_type *local_90;
  value_type *local_88;
  value_type *local_80;
  value_type *local_78;
  value_type local_70;
  value_type local_60;
  value_type local_50;
  value_type local_40;
  
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::reserve
            (positions,
             ((long)(positions->
                    super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
                    _M_impl.super__Vector_impl_data._M_finish -
             (long)(positions->
                   super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
                   _M_impl.super__Vector_impl_data._M_start) / 0xc + 0x24);
  pvVar1 = &local_40;
  local_40.x = -0.57735026;
  local_40.y = -0.57735026;
  local_40.z = -0.57735026;
  local_70.x = 0.57735026;
  local_70.y = -0.57735026;
  local_70.z = -0.57735026;
  local_50.x = 0.57735026;
  local_50.y = 0.57735026;
  local_50.z = -0.57735026;
  __x = &local_60;
  local_60.x = -0.57735026;
  local_60.y = 0.57735026;
  local_60.z = -0.57735026;
  local_d0.x = -0.57735026;
  local_d0.y = -0.57735026;
  local_d0.z = 0.57735026;
  local_e0.x = 0.57735026;
  local_e0.y = -0.57735026;
  local_e0.z = 0.57735026;
  local_f0.x = 0.57735026;
  local_f0.y = 0.57735026;
  local_f0.z = 0.57735026;
  local_100.x = -0.57735026;
  local_100.y = 0.57735026;
  local_100.z = 0.57735026;
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back(positions,pvVar1);
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back(positions,__x);
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
            (positions,&local_50);
  if ((int)CONCAT71(in_register_00000031,polygons) == 0) {
    __x_00 = &local_40;
    std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back(positions,__x_00)
    ;
    std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
              (positions,&local_50);
    __x_02 = &local_70;
    std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back(positions,__x_02)
    ;
    std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back(positions,__x_00)
    ;
    std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back(positions,__x_02)
    ;
    std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
              (positions,&local_e0);
    std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back(positions,__x_00)
    ;
    local_88 = &local_e0;
    std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
              (positions,&local_e0);
    std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
              (positions,&local_d0);
    std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back(positions,__x_00)
    ;
    local_78 = &local_d0;
    std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
              (positions,&local_d0);
    pvVar1 = &local_100;
    std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back(positions,pvVar1)
    ;
    local_104 = 3;
    __x = &local_f0;
    local_a0 = &local_60;
    __x_01 = __x;
    __x_03 = pvVar1;
    local_c0 = __x;
    local_b8 = &local_50;
    local_b0 = __x;
    local_a8 = __x_02;
    local_98 = __x;
    local_90 = local_a0;
    local_80 = &local_50;
  }
  else {
    local_104 = 4;
    local_90 = &local_f0;
    local_88 = &local_d0;
    __x_00 = &local_70;
    __x_01 = &local_e0;
    __x_02 = pvVar1;
    __x_03 = &local_50;
    local_c0 = local_88;
    local_b8 = &local_e0;
    local_b0 = &local_50;
    local_a8 = &local_100;
    local_a0 = __x_00;
    local_98 = &local_100;
    local_80 = __x;
    local_78 = local_90;
  }
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back(positions,__x_00);
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back(positions,pvVar1);
  pvVar1 = local_a0;
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back(positions,local_a0)
  ;
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back(positions,__x_01);
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back(positions,local_88)
  ;
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back(positions,__x_02);
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back(positions,local_c0)
  ;
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back(positions,local_a8)
  ;
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back(positions,local_80)
  ;
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
            (positions,&local_f0);
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back(positions,local_b8)
  ;
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back(positions,pvVar1);
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back(positions,local_b0)
  ;
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back(positions,local_90)
  ;
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back(positions,__x_03);
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back(positions,__x);
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
            (positions,&local_100);
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back(positions,local_78)
  ;
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back(positions,local_98)
  ;
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
            (positions,&local_d0);
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
            (positions,&local_e0);
  return local_104;
}

Assistant:

unsigned int StandardShapes::MakeHexahedron(std::vector<aiVector3D>& positions,
    bool polygons /*= false*/)
{
    positions.reserve(positions.size()+36);
    const ai_real length = ai_real(1.0)/ai_real(1.73205080);

    const aiVector3D v0  = aiVector3D(-1.0,-1.0,-1.0)*length;
    const aiVector3D v1  = aiVector3D(1.0,-1.0,-1.0)*length;
    const aiVector3D v2  = aiVector3D(1.0,1.0,-1.0)*length;
    const aiVector3D v3  = aiVector3D(-1.0,1.0,-1.0)*length;
    const aiVector3D v4  = aiVector3D(-1.0,-1.0,1.0)*length;
    const aiVector3D v5  = aiVector3D(1.0,-1.0,1.0)*length;
    const aiVector3D v6  = aiVector3D(1.0,1.0,1.0)*length;
    const aiVector3D v7  = aiVector3D(-1.0,1.0,1.0)*length;

    ADD_QUAD(v0,v3,v2,v1);
    ADD_QUAD(v0,v1,v5,v4);
    ADD_QUAD(v0,v4,v7,v3);
    ADD_QUAD(v6,v5,v1,v2);
    ADD_QUAD(v6,v2,v3,v7);
    ADD_QUAD(v6,v7,v4,v5);
    return (polygons ? 4 : 3);
}